

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lmathlib.c
# Opt level: O0

unsigned_long nextrand(unsigned_long *state)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  unsigned_long uVar5;
  unsigned_long uVar6;
  unsigned_long res;
  unsigned_long state3;
  unsigned_long state2;
  unsigned_long state1;
  unsigned_long state0;
  unsigned_long *state_local;
  
  uVar1 = *state;
  uVar2 = state[1];
  uVar4 = state[2] ^ uVar1;
  uVar3 = state[3];
  uVar5 = rotl(uVar2 * 5,7);
  *state = uVar1 ^ uVar3 ^ uVar2;
  state[1] = uVar2 ^ uVar4;
  state[2] = uVar4 ^ uVar2 << 0x11;
  uVar6 = rotl(uVar3 ^ uVar2,0x2d);
  state[3] = uVar6;
  return uVar5 * 9;
}

Assistant:

static Rand64 nextrand (Rand64 *state) {
  Rand64 state0 = state[0];
  Rand64 state1 = state[1];
  Rand64 state2 = state[2] ^ state0;
  Rand64 state3 = state[3] ^ state1;
  Rand64 res = rotl(state1 * 5, 7) * 9;
  state[0] = state0 ^ state3;
  state[1] = state1 ^ state2;
  state[2] = state2 ^ (state1 << 17);
  state[3] = rotl(state3, 45);
  return res;
}